

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void __thiscall Assimp::JSONWriter::EndArray(JSONWriter *this)

{
  PopIndent(this);
  AddIndentation(this);
  std::operator<<((ostream *)&this->field_0x58,"]\n");
  this->first = false;
  return;
}

Assistant:

void EndArray() {
        PopIndent();
        AddIndentation();
        buff << "]\n";
        first = false;
    }